

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O0

void __thiscall IGameController::DoTeamBalance(IGameController *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  CConfig *pCVar4;
  CGameContext *pCVar5;
  IConsole *pIVar6;
  IServer *pIVar7;
  uint uVar8;
  IGameController *in_RDI;
  long in_FS_OFFSET;
  float fVar9;
  float fVar10;
  int Temp;
  int i_1;
  float ScoreDiff;
  CPlayer *pPlayer;
  int NumBalance;
  int BiggerTeam;
  int i;
  float aPlayerScore [64];
  float aTeamScore [2];
  CGameContext *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  undefined1 in_stack_fffffffffffffebb;
  anon_union_4_2_94730284_for_vector2_base<float>_1 Team;
  uint uVar11;
  IGameController *this_00;
  int local_12c;
  int local_124;
  float local_118 [66];
  float local_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsTeamplay(in_RDI);
  if (((bVar1) && (pCVar4 = Config(in_RDI), pCVar4->m_SvTeambalanceTime != 0)) &&
     (iVar2 = absolute<int>(in_RDI->m_aTeamSize[0] - in_RDI->m_aTeamSize[1]), 1 < iVar2)) {
    pCVar5 = GameServer(in_RDI);
    pIVar6 = CGameContext::Console(pCVar5);
    (*(pIVar6->super_IInterface)._vptr_IInterface[0x19])(pIVar6,2,"game","Balancing teams",0);
    memset(local_10,0,8);
    memset(local_118,0,0x100);
    for (local_124 = 0; local_124 < 0x40; local_124 = local_124 + 1) {
      pCVar5 = GameServer(in_RDI);
      if (pCVar5->m_apPlayers[local_124] != (CPlayer *)0x0) {
        pCVar5 = GameServer(in_RDI);
        iVar2 = CPlayer::GetTeam(pCVar5->m_apPlayers[local_124]);
        if (iVar2 != -1) {
          pCVar5 = GameServer(in_RDI);
          in_stack_fffffffffffffea0 = pCVar5->m_apPlayers[local_124]->m_Score;
          pIVar7 = Server(in_RDI);
          iVar2 = IServer::TickSpeed(pIVar7);
          in_stack_fffffffffffffea4 = (float)(in_stack_fffffffffffffea0 * iVar2) * 60.0;
          pIVar7 = Server(in_RDI);
          iVar2 = IServer::Tick(pIVar7);
          pCVar5 = GameServer(in_RDI);
          local_118[local_124] =
               in_stack_fffffffffffffea4 /
               (float)(iVar2 - pCVar5->m_apPlayers[local_124]->m_ScoreStartTick);
          fVar10 = local_118[local_124];
          pCVar5 = GameServer(in_RDI);
          iVar2 = CPlayer::GetTeam(pCVar5->m_apPlayers[local_124]);
          local_10[iVar2] = fVar10 + local_10[iVar2];
        }
      }
    }
    uVar8 = (uint)(in_RDI->m_aTeamSize[0] <= in_RDI->m_aTeamSize[1]);
    local_12c = absolute<int>(in_RDI->m_aTeamSize[0] - in_RDI->m_aTeamSize[1]);
    local_12c = local_12c / 2;
    do {
      this_00 = (IGameController *)0x0;
      fVar10 = local_10[(int)uVar8];
      for (uVar11 = 0; (int)uVar11 < 0x40; uVar11 = uVar11 + 1) {
        pCVar5 = GameServer(in_RDI);
        if ((pCVar5->m_apPlayers[(int)uVar11] != (CPlayer *)0x0) &&
           (uVar3 = (**in_RDI->_vptr_IGameController)(in_RDI,(ulong)uVar11), (uVar3 & 1) != 0)) {
          pCVar5 = GameServer(in_RDI);
          uVar3 = CPlayer::GetTeam(pCVar5->m_apPlayers[(int)uVar11]);
          if ((uVar3 == uVar8) &&
             ((this_00 == (IGameController *)0x0 ||
              (fVar9 = absolute<float>((local_10[(int)(uVar8 ^ 1)] + local_118[(int)uVar11]) -
                                       (local_10[(int)uVar8] - local_118[(int)uVar11])),
              fVar9 < fVar10)))) {
            pCVar5 = GameServer(in_RDI);
            this_00 = (IGameController *)pCVar5->m_apPlayers[(int)uVar11];
            fVar10 = absolute<float>((local_10[(int)(uVar8 ^ 1)] + local_118[(int)uVar11]) -
                                     (local_10[(int)uVar8] - local_118[(int)uVar11]));
          }
        }
      }
      if (this_00 != (IGameController *)0x0) {
        Team = this_00->m_aaSpawnPoints[1][0x22].field_0;
        DoTeamChange(this_00,(CPlayer *)CONCAT44(fVar10,uVar11),(int)Team,
                     (bool)in_stack_fffffffffffffebb);
        this_00->m_aaSpawnPoints[1][0x22].field_0 = Team;
        CPlayer::Respawn((CPlayer *)in_stack_fffffffffffffe90);
        in_stack_fffffffffffffe90 = GameServer(in_RDI);
        in_stack_fffffffffffffe9c = CPlayer::GetTeam((CPlayer *)this_00);
        CPlayer::GetCID((CPlayer *)this_00);
        CGameContext::SendGameMsg
                  ((CGameContext *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
                   (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
      }
      local_12c = local_12c + -1;
    } while (local_12c != 0);
    in_RDI->m_UnbalancedTick = -1;
    GameServer(in_RDI);
    CGameContext::SendGameMsg
              ((CGameContext *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void IGameController::DoTeamBalance()
{
	if(!IsTeamplay() || !Config()->m_SvTeambalanceTime || absolute(m_aTeamSize[TEAM_RED]-m_aTeamSize[TEAM_BLUE]) < NUM_TEAMS)
		return;

	GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", "Balancing teams");

	float aTeamScore[NUM_TEAMS] = {0};
	float aPlayerScore[MAX_CLIENTS] = {0.0f};

	// gather stats
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(GameServer()->m_apPlayers[i] && GameServer()->m_apPlayers[i]->GetTeam() != TEAM_SPECTATORS)
		{
			aPlayerScore[i] = GameServer()->m_apPlayers[i]->m_Score*Server()->TickSpeed()*60.0f/
				(Server()->Tick()-GameServer()->m_apPlayers[i]->m_ScoreStartTick);
			aTeamScore[GameServer()->m_apPlayers[i]->GetTeam()] += aPlayerScore[i];
		}
	}

	int BiggerTeam = (m_aTeamSize[TEAM_RED] > m_aTeamSize[TEAM_BLUE]) ? TEAM_RED : TEAM_BLUE;
	int NumBalance = absolute(m_aTeamSize[TEAM_RED]-m_aTeamSize[TEAM_BLUE]) / NUM_TEAMS;

	// balance teams
	do
	{
		CPlayer *pPlayer = 0;
		float ScoreDiff = aTeamScore[BiggerTeam];
		for(int i = 0; i < MAX_CLIENTS; i++)
		{
			if(!GameServer()->m_apPlayers[i] || !CanBeMovedOnBalance(i))
				continue;

			// remember the player whom would cause lowest score-difference
			if(GameServer()->m_apPlayers[i]->GetTeam() == BiggerTeam &&
				(!pPlayer || absolute((aTeamScore[BiggerTeam^1]+aPlayerScore[i]) - (aTeamScore[BiggerTeam]-aPlayerScore[i])) < ScoreDiff))
			{
				pPlayer = GameServer()->m_apPlayers[i];
				ScoreDiff = absolute((aTeamScore[BiggerTeam^1]+aPlayerScore[i]) - (aTeamScore[BiggerTeam]-aPlayerScore[i]));
			}
		}

		// move the player to the other team
		if(pPlayer)
		{
			int Temp = pPlayer->m_LastActionTick;
			DoTeamChange(pPlayer, BiggerTeam^1);
			pPlayer->m_LastActionTick = Temp;
			pPlayer->Respawn();
			GameServer()->SendGameMsg(GAMEMSG_TEAM_BALANCE_VICTIM, pPlayer->GetTeam(), pPlayer->GetCID());
		}
	}
	while(--NumBalance);

	m_UnbalancedTick = TBALANCE_OK;
	GameServer()->SendGameMsg(GAMEMSG_TEAM_BALANCE, -1);
}